

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

void envydis(disisa *isa,FILE *out,uint8_t *code,uint32_t start,int num,int vartype,int ptype,
            int quiet,label *labels,int labelsnum)

{
  label *plVar1;
  ulong *puVar2;
  byte bVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  char **ppcVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  char *pcVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  char *pcVar19;
  char *__format;
  uint uVar20;
  ulong uVar21;
  byte *pbVar22;
  int iVar23;
  size_t __nmemb;
  bool bVar24;
  undefined1 auVar25 [16];
  ull a [2];
  ull m [2];
  disctx c;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  ulong local_c8;
  disctx local_c0;
  ulong local_38;
  
  uVar21 = (ulong)(uint)num;
  memset(&local_c0,0,0x88);
  __nmemb = (size_t)((isa->posunit + num + -1) / isa->posunit);
  local_c0.code8 = code;
  local_c0.marks = (int *)calloc(__nmemb,4);
  local_c0.names = (char **)calloc(__nmemb,8);
  local_c0.codebase = start;
  local_c0.codesz = num;
  local_c0.vartype = vartype;
  local_c0.ptype = ptype;
  local_c0.isa = isa;
  local_c0.labels = labels;
  local_c0.labelsnum = labelsnum;
  if (labels == (label *)0x0) {
    if (0 < num) {
      iVar16 = 0;
      do {
        local_e8 = 0;
        uStack_e0 = 0;
        local_d8 = 0;
        uStack_d0 = 0;
        iVar8 = num;
        if (num < iVar16) {
          iVar8 = iVar16;
        }
        lVar12 = -0x80;
        uVar18 = 0;
        do {
          if ((uint)(iVar8 - iVar16) == uVar18) break;
          puVar2 = (ulong *)((long)&local_e8 + (ulong)((uint)uVar18 & 0xfffffff8));
          *puVar2 = *puVar2 | (ulong)code[uVar18 + (long)iVar16] << ((char)lVar12 + 0x80U & 0x38);
          uVar18 = uVar18 + 1;
          lVar12 = lVar12 + 8;
        } while (lVar12 != 0);
        local_c0.oplen = 0;
        local_c0.pos = iVar16 / isa->posunit + start;
        atomtab(&local_c0,&local_e8,&local_d8,isa->troot,0);
        iVar16 = iVar16 + local_c0.oplen + (uint)(local_c0.oplen == 0);
      } while (iVar16 < num);
    }
  }
  else {
    if (0 < labelsnum) {
      uVar18 = 0;
      do {
        uVar4 = labels[uVar18].val;
        uVar9 = (uint)uVar4;
        if ((start <= uVar9) && (uVar9 < (uint)num / (uint)isa->posunit + start)) {
          local_c0.marks[uVar9 - start] = local_c0.marks[uVar9 - start] | labels[uVar18].type;
        }
        plVar1 = labels + uVar18;
        if (((start <= uVar4) && (uVar4 < start + num)) && (plVar1->name != (char *)0x0)) {
          local_c0.names[uVar4 - start] = plVar1->name;
        }
        if ((plVar1->size != 0) && (plVar1->size != 0)) {
          uVar20 = 0;
          do {
            uVar15 = uVar9 + uVar20;
            if ((start <= uVar15) && (uVar15 < (uint)num / (uint)isa->posunit + start)) {
              local_c0.marks[uVar15 - start] = local_c0.marks[uVar15 - start] | plVar1->type;
            }
            uVar20 = uVar20 + 4;
          } while (uVar20 < plVar1->size);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != (uint)labelsnum);
    }
    if (0 < num) {
      bVar5 = true;
      iVar16 = 0;
      uVar9 = 0;
      do {
        do {
          if (uVar9 == 0) {
            iVar8 = iVar16 / isa->posunit;
            uVar9 = local_c0.marks[iVar8];
            bVar7 = true;
            if ((char)((uVar9 & 8) >> 3) == '\0' && (uVar9 & 3) != 0) {
              local_c0.marks[iVar8] = uVar9 | 8;
              bVar5 = false;
              goto LAB_0016d3cf;
            }
          }
          else {
LAB_0016d3cf:
            bVar7 = false;
          }
          if (bVar7) {
            iVar16 = iVar16 + 1;
            uVar9 = 0;
          }
          else {
            local_e8 = 0;
            uStack_e0 = 0;
            local_d8 = 0;
            uStack_d0 = 0;
            iVar8 = num;
            if (num < iVar16) {
              iVar8 = iVar16;
            }
            lVar12 = -0x80;
            uVar18 = 0;
            do {
              if ((uint)(iVar8 - iVar16) == uVar18) break;
              puVar2 = (ulong *)((long)&local_e8 + (ulong)((uint)uVar18 & 0xfffffff8));
              *puVar2 = *puVar2 | (ulong)code[uVar18 + (long)iVar16] <<
                                  ((char)lVar12 + 0x80U & 0x38);
              uVar18 = uVar18 + 1;
              lVar12 = lVar12 + 8;
            } while (lVar12 != 0);
            local_c0.oplen = 0;
            local_c0.pos = iVar16 / isa->posunit + start;
            local_c0.endmark = 0;
            atomtab(&local_c0,&local_e8,&local_d8,isa->troot,0);
            uVar9 = 0;
            if ((local_c0.oplen != 0) && (uVar9 = 0, local_c0.endmark == 0)) {
              uVar9 = (local_c0.marks[iVar16 / isa->posunit] & 4U) >> 2 ^ 1;
              iVar8 = local_c0.oplen;
              if ((local_c0.marks[iVar16 / isa->posunit] & 4U) != 0) {
                iVar8 = 0;
              }
              iVar16 = iVar16 + iVar8;
            }
          }
        } while (iVar16 < num);
        if (bVar5) break;
        iVar16 = 0;
        uVar9 = 0;
        bVar5 = true;
      } while (0 < num);
    }
  }
  if (num < 1) {
LAB_0016dec1:
    free(local_c0.marks);
    return;
  }
  local_38 = uVar21;
  iVar16 = 0;
  bVar5 = false;
  uVar9 = 0;
  bVar7 = false;
  local_c8 = uVar21;
LAB_0016d5cb:
  iVar8 = isa->posunit;
  uVar20 = 0;
  if ((iVar16 % iVar8 == 0) &&
     (uVar20 = local_c0.marks[iVar16 / iVar8], local_c0.names[iVar16 / iVar8] != (char *)0x0)) {
    if (uVar9 != 0) {
      pcVar19 = "%s[%x bytes skipped]\n";
      if (!bVar5) {
        pcVar19 = "%s[%x zero bytes skipped]\n";
      }
      ppcVar10 = &cunk;
      if (!bVar5) {
        ppcVar10 = &cnorm;
      }
      bVar5 = false;
      fprintf((FILE *)out,pcVar19,*ppcVar10,(ulong)uVar9);
    }
    if ((uVar20 & 0x30) == 0) {
      if ((uVar20 & 2) == 0) {
        pcVar19 = local_c0.names[iVar16 / isa->posunit];
        pcVar14 = cbtarg;
        if ((uVar20 & 1) == 0) {
          pcVar14 = cnorm;
        }
        __format = "%s%s:\n";
      }
      else {
        pcVar19 = local_c0.names[iVar16 / isa->posunit];
        __format = "\n%s%s:\n";
        pcVar14 = cctarg;
      }
    }
    else {
      pcVar19 = local_c0.names[iVar16 / isa->posunit];
      __format = "%s%s:\n";
      pcVar14 = cnorm;
    }
    uVar9 = 0;
    fprintf((FILE *)out,__format,pcVar14,pcVar19);
  }
  iVar8 = (int)uVar21;
  if ((uVar20 & 0x30) != 0) {
    if (uVar9 != 0) {
      pcVar19 = "%s[%x bytes skipped]\n";
      if (!bVar5) {
        pcVar19 = "%s[%x zero bytes skipped]\n";
      }
      ppcVar10 = &cunk;
      if (!bVar5) {
        ppcVar10 = &cnorm;
      }
      bVar5 = false;
      fprintf((FILE *)out,pcVar19,*ppcVar10,(ulong)uVar9);
    }
    fprintf((FILE *)out,"%s%08x:%s",cnum,(ulong)(start + iVar16 / isa->posunit),cnorm);
    if ((uVar20 & 0x10) == 0) {
      fprintf((FILE *)out," %s\"",cmem);
      pbVar22 = code + iVar16;
      do {
        iVar16 = iVar16 + 1;
        bVar3 = *pbVar22;
        uVar9 = (uint)bVar3;
        if (bVar3 < 0x22) {
          if (bVar3 == 10) {
            pcVar19 = "\\n";
            goto LAB_0016d802;
          }
          if (uVar9 == 0) goto LAB_0016d8e1;
LAB_0016d814:
          fputc(uVar9,(FILE *)out);
        }
        else {
          if (uVar9 == 0x22) {
            pcVar19 = "\\\"";
          }
          else {
            if (uVar9 != 0x5c) goto LAB_0016d814;
            pcVar19 = "\\\\";
          }
LAB_0016d802:
          fwrite(pcVar19,2,1,(FILE *)out);
        }
        pbVar22 = pbVar22 + 1;
      } while( true );
    }
    if (iVar8 < iVar16) {
      iVar8 = iVar16;
    }
    pbVar22 = code + iVar16;
    lVar12 = 0;
    uVar9 = 0;
    do {
      if ((ulong)(uint)(iVar8 - iVar16) << 3 == lVar12) break;
      uVar9 = uVar9 | (uint)*pbVar22 << ((byte)lVar12 & 0x1f);
      pbVar22 = pbVar22 + 1;
      lVar12 = lVar12 + 8;
    } while (lVar12 != 0x20);
    fprintf((FILE *)out," %s%08x\n",cmem,(ulong)uVar9);
    iVar16 = (int)(4 / (long)isa->posunit) + iVar16;
    goto LAB_0016d8fd;
  }
  if (((labels == (label *)0x0) || (bVar7)) || ((uVar20 & 7) != 0)) {
    if (uVar9 != 0) {
      pcVar19 = "%s[%x bytes skipped]\n";
      if (!bVar5) {
        pcVar19 = "%s[%x zero bytes skipped]\n";
      }
      ppcVar10 = &cunk;
      if (!bVar5) {
        ppcVar10 = &cnorm;
      }
      bVar5 = false;
      fprintf((FILE *)out,pcVar19,*ppcVar10);
    }
    local_e8 = 0;
    uStack_e0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    if (iVar8 < iVar16) {
      iVar8 = iVar16;
    }
    lVar12 = -0x80;
    uVar18 = 0;
    do {
      if ((uint)(iVar8 - iVar16) == uVar18) break;
      puVar2 = (ulong *)((long)&local_e8 + (ulong)((uint)uVar18 & 0xfffffff8));
      *puVar2 = *puVar2 | (ulong)code[uVar18 + (long)iVar16] << ((char)lVar12 + 0x80U & 0x38);
      uVar18 = uVar18 + 1;
      lVar12 = lVar12 + 8;
    } while (lVar12 != 0);
    local_c0.oplen = 0;
    local_c0.pos = iVar16 / isa->posunit + start;
    local_c0.atomsnum = 0;
    local_c0.endmark = 0;
    atomtab(&local_c0,&local_e8,&local_d8,isa->troot,0);
    bVar6 = local_c0.endmark == 0;
    if (((uVar20 & 2) != 0) && (local_c0.names[iVar16 / isa->posunit] == (char *)0x0)) {
      fputc(10,(FILE *)out);
    }
    switch(uVar20 & 3) {
    case 0:
      if (quiet == 0) {
        iVar8 = isa->posunit;
        pcVar19 = cnorm;
        goto LAB_0016daa9;
      }
      goto LAB_0016dab0;
    case 1:
      pcVar19 = cbtarg;
      break;
    case 2:
      pcVar19 = cctarg;
      break;
    case 3:
      pcVar19 = cbctarg;
    }
    iVar8 = isa->posunit;
LAB_0016daa9:
    fprintf((FILE *)out,"%s%08x:%s",pcVar19,(ulong)(start + iVar16 / iVar8),cnorm);
LAB_0016dab0:
    if (quiet == 0) {
      if (0 < isa->maxoplen) {
        iVar8 = 0;
        do {
          fputc(0x20,(FILE *)out);
          if (0 < (long)isa->opunit) {
            lVar12 = (long)isa->opunit + 1;
            do {
              if ((lVar12 + iVar8 == 2) || (lVar12 + iVar8 + -2 < (long)local_c0.oplen)) {
                if ((iVar16 + iVar8) + lVar12 + -2 < (long)local_38) {
                  fprintf((FILE *)out,"%s%02x",cnorm,
                          (ulong)code[lVar12 + (long)(iVar16 + iVar8) + -2]);
                }
                else {
                  fprintf((FILE *)out,"%s??",cunk);
                }
              }
              else {
                fwrite("  ",2,1,(FILE *)out);
              }
              lVar12 = lVar12 + -1;
            } while (1 < lVar12);
          }
          iVar8 = iVar8 + isa->opunit;
        } while (iVar8 < isa->maxoplen);
      }
      fwrite("  ",2,1,(FILE *)out);
      if ((uVar20 & 2) == 0) {
        fputc(0x20,(FILE *)out);
      }
      else {
        fprintf((FILE *)out,"%sC",cctarg);
      }
      uVar21 = local_c8;
      if ((uVar20 & 1) == 0) {
        iVar8 = 0x20;
        goto LAB_0016dc20;
      }
      fprintf((FILE *)out,"%sB",cbtarg);
    }
    else if ((quiet == 1) && (uVar20 != 0)) {
      iVar8 = 10;
LAB_0016dc20:
      fputc(iVar8,(FILE *)out);
    }
    if (0 < local_c0.atomsnum) {
      lVar12 = 0;
      bVar24 = false;
      do {
        if (((quiet == 0 || lVar12 != 0) && (local_c0.atoms[lVar12]->type != EXPR_SEEND)) &&
           (!bVar24)) {
          fputc(0x20,(FILE *)out);
        }
        printexpr(out,local_c0.atoms[lVar12],0);
        bVar24 = local_c0.atoms[lVar12]->type == EXPR_SESTART;
        lVar12 = lVar12 + 1;
      } while (lVar12 < local_c0.atomsnum);
    }
    if (local_c0.oplen == 0) {
      fprintf((FILE *)out," %s[unknown op length]%s",cunk,cnorm);
      iVar8 = 1;
    }
    else {
      iVar8 = local_c0.oplen;
      if (local_c0.oplen < 0x10) {
        iVar13 = local_c0.oplen * 8;
        do {
          iVar17 = iVar8 + 7;
          if (-1 < iVar8) {
            iVar17 = iVar8;
          }
          (&local_e8)[iVar17 >> 3] = (&local_e8)[iVar17 >> 3] & ~(0xffL << ((byte)iVar13 & 0x38));
          iVar8 = iVar8 + 1;
          iVar13 = iVar13 + 8;
        } while (iVar8 != 0x10);
      }
      local_e8._0_4_ = ~(uint)local_d8 & (uint)local_e8;
      local_e8._4_4_ = ~local_d8._4_4_ & local_e8._4_4_;
      uStack_e0._0_4_ = ~(uint)uStack_d0 & (uint)uStack_e0;
      uStack_e0._4_4_ = ~uStack_d0._4_4_ & uStack_e0._4_4_;
      auVar25._0_4_ = -(uint)((uint)local_e8 == 0);
      auVar25._4_4_ = -(uint)(local_e8._4_4_ == 0);
      auVar25._8_4_ = -(uint)((uint)uStack_e0 == 0);
      auVar25._12_4_ = -(uint)(uStack_e0._4_4_ == 0);
      iVar8 = movmskps(iVar8,auVar25);
      if (iVar8 != 0xf) {
        iVar8 = 0;
        fprintf((FILE *)out," %s[unknown:",cunk);
        do {
          fputc(0x20,(FILE *)out);
          iVar13 = isa->opunit;
          if (0 < iVar13) {
            iVar17 = (iVar13 + iVar8 + -1) * 8;
            do {
              iVar23 = iVar13 + -1;
              if (iVar16 + iVar8 + iVar23 < (int)uVar21) {
                iVar11 = iVar8 + 7 + iVar23;
                if (-1 < iVar8 + iVar23) {
                  iVar11 = iVar8 + iVar23;
                }
                fprintf((FILE *)out,"%02llx",
                        (ulong)(&local_e8)[iVar11 >> 3] >> ((byte)iVar17 & 0x38) & 0xff);
              }
              else {
                fwrite("??",2,1,(FILE *)out);
              }
              iVar17 = iVar17 + -8;
              bVar24 = 1 < iVar13;
              iVar13 = iVar23;
            } while (bVar24);
          }
          iVar8 = iVar8 + isa->opunit;
        } while ((iVar8 == 0) || (iVar8 < local_c0.oplen));
        fputc(0x5d,(FILE *)out);
      }
      iVar8 = local_c0.oplen;
      if ((int)uVar21 < local_c0.oplen + iVar16) {
        fprintf((FILE *)out," %s[incomplete]%s",cunk,cnorm);
        iVar8 = local_c0.oplen;
      }
    }
    bVar7 = ((uVar20 & 4) == 0 && bVar6) && (bVar7 || (uVar20 & 7) != 0);
    iVar16 = iVar8 + iVar16;
    uVar9 = 0;
    fprintf((FILE *)out,"%s\n",cnorm);
  }
  else {
    if (code[iVar16] != '\0') {
      bVar5 = true;
    }
    iVar16 = iVar16 + 1;
    uVar9 = uVar9 + 1;
    bVar7 = false;
  }
  goto LAB_0016de9d;
LAB_0016d8e1:
  fwrite("\"\n",2,1,(FILE *)out);
LAB_0016d8fd:
  uVar9 = 0;
LAB_0016de9d:
  if ((int)uVar21 <= iVar16) goto LAB_0016dec1;
  goto LAB_0016d5cb;
}

Assistant:

void envydis (const struct disisa *isa, FILE *out, uint8_t *code, uint32_t start, int num, int vartype, int ptype, int quiet, struct label *labels, int labelsnum)
{
	struct disctx c = { 0 };
	struct disctx *ctx = &c;
	int cur = 0, i, j;
	ctx->code8 = code;
	ctx->marks = calloc((num + isa->posunit - 1) / isa->posunit, sizeof *ctx->marks);
	ctx->names = calloc((num + isa->posunit - 1) / isa->posunit, sizeof *ctx->names);
	ctx->codebase = start;
	ctx->codesz = num;
	ctx->vartype = vartype;
	ctx->ptype = ptype;
	ctx->isa = isa;
	ctx->labels = labels;
	ctx->labelsnum = labelsnum;
	if (labels) {
		for (i = 0; i < labelsnum; i++) {
			mark(ctx, labels[i].val, labels[i].type);
			if (labels[i].val >= ctx->codebase && labels[i].val < ctx->codebase + ctx->codesz) {
				if (labels[i].name)
					ctx->names[labels[i].val - ctx->codebase] = labels[i].name;
			}
			if (labels[i].size) {
				for (j = 0; j < labels[i].size; j+=4)
					mark(ctx, labels[i].val + j, labels[i].type);
			}
		}
		int done;
		do {
			done = 1;
			cur = 0;
			int active = 0;
			while (cur < num) {
				if (!active && (ctx->marks[cur / isa->posunit] & 3) && !(ctx->marks[cur / isa->posunit] & 8)) {
					done = 0;
					active = 1;
					ctx->marks[cur / isa->posunit] |= 8;
				}
				if (active) {
					ull a[MAXOPLEN] = {0}, m[MAXOPLEN] = {0};
					for (i = 0; i < MAXOPLEN*8 && cur + i < num; i++) {
						a[i/8] |= (ull)code[cur + i] << (i&7)*8;
					}
					ctx->oplen = 0;
					ctx->pos = cur / isa->posunit + start;
					ctx->endmark = 0;
					atomtab (ctx, a, m, isa->troot, 0);
					if (ctx->oplen && !ctx->endmark && !(ctx->marks[cur / isa->posunit] & 4))
						cur += ctx->oplen;
					else
						active = 0;
				} else {
					cur++;
				}
			}
		} while (!done);
	} else {
		while (cur < num) {
			ull a[MAXOPLEN] = {0}, m[MAXOPLEN] = {0};
			for (i = 0; i < MAXOPLEN*8 && cur + i < num; i++) {
				a[i/8] |= (ull)code[cur + i] << (i&7)*8;
			}
			ctx->oplen = 0;
			ctx->pos = cur / isa->posunit + start;
			atomtab (ctx, a, m, isa->troot, 0);
			if (ctx->oplen)
				cur += ctx->oplen;
			else
				cur++;
		}
	}
	cur = 0;
	int active = 0;
	int skip = 0, nonzero = 0;
	while (cur < num) {
		int mark = (cur % isa->posunit ? 0 : ctx->marks[cur / isa->posunit]);
		if (!(cur % isa->posunit) && ctx->names[cur / isa->posunit]) {
			if (skip) {
				if (nonzero)
					fprintf(out, "%s[%x bytes skipped]\n", cunk, skip);
				else
					fprintf(out, "%s[%x zero bytes skipped]\n", cnorm, skip);
				skip = 0;
				nonzero = 0;
			}
			if (mark & 0x30)
				fprintf (out, "%s%s:\n", cnorm, ctx->names[cur / isa->posunit]);
			else if (mark & 2)
				fprintf (out, "\n%s%s:\n", cctarg, ctx->names[cur / isa->posunit]);
			else if (mark & 1)
				fprintf (out, "%s%s:\n", cbtarg, ctx->names[cur / isa->posunit]);
			else
				fprintf (out, "%s%s:\n", cnorm, ctx->names[cur / isa->posunit]);
		}
		if (mark & 0x30) {
			if (skip) {
				if (nonzero)
					fprintf(out, "%s[%x bytes skipped]\n", cunk, skip);
				else
					fprintf(out, "%s[%x zero bytes skipped]\n", cnorm, skip);
				skip = 0;
				nonzero = 0;
			}
			fprintf (out, "%s%08x:%s", cnum, cur / isa->posunit + start, cnorm);
			if (mark & 0x10) {
				uint32_t val = 0;
				for (i = 0; i < 4 && cur + i < num; i++) {
					val |= code[cur + i] << i*8;
				}
				fprintf (out, " %s%08x\n", cmem, val);
				cur += 4 / isa->posunit;
			} else {
				fprintf (out, " %s\"", cmem);
				while (code[cur]) {
					switch (code[cur]) {
						case '\n':
							fprintf (out, "\\n");
							break;
						case '\\':
							fprintf (out, "\\\\");
							break;
						case '\"':
							fprintf (out, "\\\"");
							break;
						default:
							fprintf (out, "%c", code[cur]);
							break;
					}
					cur++;
				}
				cur++;
				fprintf (out, "\"\n");
			}
			continue;
		}
		if (!active && mark & 7)
			active = 1;
		if (!active && labels) {
			if (code[cur])
				nonzero = 1;
			cur++;
			skip++;
			continue;
		}
		if (skip) {
			if (nonzero)
				fprintf(out, "%s[%x bytes skipped]\n", cunk, skip);
			else
				fprintf(out, "%s[%x zero bytes skipped]\n", cnorm, skip);
			skip = 0;
			nonzero = 0;
		}
		ull a[MAXOPLEN] = {0}, m[MAXOPLEN] = {0};
		for (i = 0; i < MAXOPLEN*8 && cur + i < num; i++) {
			a[i/8] |= (ull)code[cur + i] << (i&7)*8;
		}
		ctx->oplen = 0;
		ctx->pos = cur / isa->posunit + start;
		ctx->atomsnum = 0;
		ctx->endmark = 0;
		atomtab (ctx, a, m, isa->troot, 0);

		if (ctx->endmark || mark & 4)
			active = 0;

		if (mark & 2 && !ctx->names[cur / isa->posunit])
			fprintf (out, "\n");
		switch (mark & 3) {
			case 0:
				if (!quiet)
					fprintf (out, "%s%08x:%s", cnorm, cur / isa->posunit + start, cnorm);
				break;
			case 1:
				fprintf (out, "%s%08x:%s", cbtarg, cur / isa->posunit + start, cnorm);
				break;
			case 2:
				fprintf (out, "%s%08x:%s", cctarg, cur / isa->posunit + start, cnorm);
				break;
			case 3:
				fprintf (out, "%s%08x:%s", cbctarg, cur / isa->posunit + start, cnorm);
				break;
		}

		if (!quiet) {
			for (i = 0; i < isa->maxoplen; i += isa->opunit) {
				fprintf (out, " ");
				for (j = isa->opunit - 1; j >= 0; j--)
					if (i+j && i+j >= ctx->oplen)
						fprintf (out, "  ");
					else if (cur+i+j >= num)
						fprintf (out, "%s??", cunk);
					else
						fprintf (out, "%s%02x", cnorm, code[cur + i + j]);
			}
			fprintf (out, "  ");

			if (mark & 2)
				fprintf (out, "%sC", cctarg);
			else
				fprintf (out, " ");
			if (mark & 1)
				fprintf (out, "%sB", cbtarg);
			else
				fprintf (out, " ");
		} else if (quiet == 1) {
			if (mark)
				fprintf (out, "\n");
		}

		int noblank = 0;

		for (i = 0; i < ctx->atomsnum; i++) {
			if (ctx->atoms[i]->type == EXPR_SEEND)
				noblank = 1;
			if ((i || !quiet) && !noblank)
				fprintf (out, " ");
			printexpr(out, ctx->atoms[i], 0);
			noblank = (ctx->atoms[i]->type == EXPR_SESTART);
		}

		if (ctx->oplen) {
			int fl = 0;
			for (i = ctx->oplen; i < MAXOPLEN * 8; i++)
				a[i/8] &= ~(0xffull << (i & 7) * 8);
			for (i = 0; i < MAXOPLEN; i++) {
				a[i] &= ~m[i];
				if (a[i])
					fl = 1;
			}
			if (fl) {
				fprintf (out, " %s[unknown:", cunk);
				for (i = 0; i < ctx->oplen || i == 0; i += isa->opunit) {
					fprintf (out, " ");
					for (j = isa->opunit - 1; j >= 0; j--)
						if (cur+i+j >= num)
							fprintf (out, "??");
						else
							fprintf (out, "%02llx", (a[(i+j)/8] >> ((i + j)&7) * 8) & 0xff);
				}
				fprintf (out, "]");
			}
			if (cur + ctx->oplen > num) {
				fprintf (out, " %s[incomplete]%s", cunk, cnorm);
			}
			cur += ctx->oplen;
		} else {
			fprintf (out, " %s[unknown op length]%s", cunk, cnorm);
			cur++;
		}
		fprintf (out, "%s\n", cnorm);
	}
	free(ctx->marks);
}